

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

Id __thiscall spv::Builder::getContainedTypeId(Builder *this,Id typeId,int member)

{
  Op OVar1;
  Instruction *this_00;
  Id IVar2;
  ulong uVar3;
  
  this_00 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start[typeId];
  OVar1 = this_00->opCode;
  uVar3 = (ulong)OVar1;
  if (uVar3 < 0x21) {
    if ((0x31800000UL >> (uVar3 & 0x3f) & 1) == 0) {
      if (uVar3 == 0x1e) goto LAB_003d2d87;
      if (uVar3 == 0x20) {
        member = 1;
        goto LAB_003d2d87;
      }
      goto LAB_003d2d9f;
    }
  }
  else {
LAB_003d2d9f:
    if ((OVar1 != OpTypeCooperativeMatrixKHR) && (OVar1 != OpTypeCooperativeVectorNV)) {
      member = 0;
      if (OVar1 != OpTypeCooperativeMatrixNV) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0x5b0,"Id spv::Builder::getContainedTypeId(Id, int) const");
      }
      goto LAB_003d2d87;
    }
  }
  member = 0;
LAB_003d2d87:
  IVar2 = Instruction::getIdOperand(this_00,member);
  return IVar2;
}

Assistant:

Instruction* getInstruction(Id id) const { return idToInstruction[id]; }